

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
* __thiscall
Lib::
OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
::operator=(OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
            *this,OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>_>_>
                  *other)

{
  long *plVar1;
  long *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  bool bVar6;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if ((this->_isSome == true) &&
     (plVar2 = *(long **)((long)&(this->_elem)._elem + 0x10), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  bVar6 = other->_isSome;
  if (bVar6 == true) {
    uVar3 = *(undefined8 *)&(other->_elem)._elem;
    uVar4 = *(undefined8 *)((long)&(other->_elem)._elem + 8);
    plVar2 = *(long **)((long)&(other->_elem)._elem + 0x10);
    if (plVar2 == (long *)0x0) {
      uVar5 = (other->_elem)._elem.init._func._c.second._content;
      (this->_elem)._elem.init._func._c.first = (other->_elem)._elem.init._func._c.first;
      (this->_elem)._elem.init._func._c.second._content = uVar5;
      (this->_elem)._elem.init._inner._core =
           (IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::TermLiteralClause>_>
            *)0x0;
    }
    else {
      *(int *)(plVar2 + 1) = (int)plVar2[1] + 1;
      local_28 = (undefined4)uVar3;
      uStack_24 = (undefined4)((ulong)uVar3 >> 0x20);
      uStack_20 = (undefined4)uVar4;
      uStack_1c = (undefined4)((ulong)uVar4 >> 0x20);
      *(undefined4 *)&(this->_elem)._elem = local_28;
      *(undefined4 *)((long)&(this->_elem)._elem + 4) = uStack_24;
      *(undefined4 *)((long)&(this->_elem)._elem + 8) = uStack_20;
      *(undefined4 *)((long)&(this->_elem)._elem + 0xc) = uStack_1c;
      *(long **)((long)&(this->_elem)._elem + 0x10) = plVar2;
      if ((int)plVar2[1] == 0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    bVar6 = other->_isSome;
  }
  this->_isSome = bVar6;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }